

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O2

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::GetMessage
          (ExtensionSet *this,int number,Descriptor *message_type,MessageFactory *factory)

{
  MessageLite *pMVar1;
  int iVar2;
  Extension *pEVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  pEVar3 = FindOrNull(this,number);
  if (pEVar3 != (Extension *)0x0) {
    if ((pEVar3->field_0xa & 1) == 0) {
      pMVar1 = (pEVar3->field_0).message_value;
      if ((pEVar3->field_0xa & 0x10) == 0) {
        return pMVar1;
      }
      iVar2 = (*factory->_vptr_MessageFactory[2])(factory,message_type);
      iVar2 = (*pMVar1->_vptr_MessageLite[3])(pMVar1,CONCAT44(extraout_var_00,iVar2));
      return (MessageLite *)CONCAT44(extraout_var_01,iVar2);
    }
  }
  iVar2 = (*factory->_vptr_MessageFactory[2])(factory,message_type);
  return (MessageLite *)CONCAT44(extraout_var,iVar2);
}

Assistant:

const MessageLite& ExtensionSet::GetMessage(int number,
                                            const Descriptor* message_type,
                                            MessageFactory* factory) const {
  const Extension* extension = FindOrNull(number);
  if (extension == NULL || extension->is_cleared) {
    // Not present.  Return the default value.
    return *factory->GetPrototype(message_type);
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL, MESSAGE);
    if (extension->is_lazy) {
      return extension->lazymessage_value->GetMessage(
          *factory->GetPrototype(message_type));
    } else {
      return *extension->message_value;
    }
  }
}